

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

bool proto2_unittest::TestParsingMergeLite::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized
                    ((ExtensionSet *)(msg + 1),
                     (MessageLite *)_TestParsingMergeLite_default_instance_);
  if (bVar1) {
    bVar1 = (bool)((byte)msg[2]._internal_metadata_.ptr_ & 1);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PROTOBUF_NOINLINE bool TestParsingMergeLite::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const TestParsingMergeLite&>(msg);
  if (!this_._impl_._extensions_.IsInitialized(&default_instance())) {
    return false;
  }
  if (_Internal::MissingRequiredFields(this_._impl_._has_bits_)) {
    return false;
  }
  return true;
}